

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
* __thiscall
slang::
SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
::operator=(SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
            *this,SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                  *rhs)

{
  ulong uVar1;
  size_type sVar2;
  size_type sVar3;
  const_iterator pvVar4;
  const_iterator __ofirst;
  iterator pvVar5;
  SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  *in_RSI;
  SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  *in_RDI;
  iterator newEnd;
  variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
  *in_stack_ffffffffffffff58;
  SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  *in_stack_ffffffffffffff60;
  SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  *in_stack_ffffffffffffff68;
  SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  *in_stack_ffffffffffffff70;
  const_iterator in_stack_ffffffffffffff78;
  __uninitialized_copy_fn *in_stack_ffffffffffffff80;
  
  if (in_RDI != in_RSI) {
    uVar1 = in_RDI->len;
    sVar2 = size(in_RSI);
    if (uVar1 < sVar2) {
      sVar2 = capacity(in_RDI);
      sVar3 = size(in_RSI);
      if (sVar2 < sVar3) {
        clear(in_stack_ffffffffffffff60);
        size(in_RSI);
        reserve(in_stack_ffffffffffffff70,(size_type)in_stack_ffffffffffffff68);
      }
      else if (in_RDI->len != 0) {
        in_stack_ffffffffffffff78 = begin(in_RSI);
        pvVar4 = begin(in_RSI);
        in_stack_ffffffffffffff80 = (__uninitialized_copy_fn *)(pvVar4 + in_RDI->len);
        begin(in_RDI);
        std::ranges::__copy_fn::
        operator()<const_std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_*,_const_std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_*,_std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_*>
                  ((__copy_fn *)in_stack_ffffffffffffff70,
                   (variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                    *)in_stack_ffffffffffffff68,
                   (variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                    *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      }
      pvVar4 = begin(in_RSI);
      pvVar4 = pvVar4 + in_RDI->len;
      __ofirst = end(in_RSI);
      pvVar5 = begin(in_RDI);
      pvVar5 = pvVar5 + in_RDI->len;
      begin(in_RDI);
      size(in_RSI);
      std::ranges::__uninitialized_copy_fn::
      operator()<const_std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_*,_const_std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_*,_std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_*,_std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_*>
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,pvVar5,__ofirst,pvVar4);
      sVar2 = size(in_RSI);
      in_RDI->len = sVar2;
    }
    else {
      sVar2 = size(in_RSI);
      if (sVar2 == 0) {
        begin(in_RDI);
      }
      else {
        begin(in_RDI);
        std::ranges::__copy_fn::
        operator()<const_slang::SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>_&,_std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_*>
                  ((__copy_fn *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                   (variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                    *)in_stack_ffffffffffffff60);
      }
      end(in_RDI);
      std::ranges::__destroy_fn::
      operator()<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_*,_std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_*>
                ((__destroy_fn *)in_stack_ffffffffffffff70,
                 (variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                  *)in_stack_ffffffffffffff68,
                 (variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                  *)in_stack_ffffffffffffff60);
      sVar2 = size(in_RSI);
      in_RDI->len = sVar2;
    }
  }
  return in_RDI;
}

Assistant:

SmallVectorBase<T>& SmallVectorBase<T>::operator=(const SmallVectorBase<T>& rhs) {
    if (this == &rhs)
        return *this;

    // If we already have sufficient space assign the common elements,
    // then destroy any excess.
    if (len >= rhs.size()) {
        iterator newEnd;
        if (rhs.size())
            newEnd = std::ranges::copy(rhs, begin()).out;
        else
            newEnd = begin();

        std::ranges::destroy(newEnd, end());
        len = rhs.size();
        return *this;
    }

    if (capacity() < rhs.size()) {
        // If we have to grow to have enough elements, destroy the current elements.
        // This allows us to avoid copying them during the grow.
        clear();
        reserve(rhs.size());
    }
    else if (len) {
        // Otherwise, use assignment for the already-constructed elements.
        std::ranges::copy(rhs.begin(), rhs.begin() + len, begin());
    }

    // Copy construct the new elements in place.
    std::ranges::uninitialized_copy(rhs.begin() + len, rhs.end(), begin() + len,
                                    begin() + rhs.size());
    len = rhs.size();
    return *this;
}